

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

double __thiscall soplex::SPxLPBase<double>::minAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  double *pdVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double dVar6;
  
  ::soplex::infinity::__tls_init();
  pdVar1 = (double *)__tls_get_addr(&PTR_003b6b60);
  dVar5 = *pdVar1;
  if ((unscaled) && (this->_isScaled == true)) {
    if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      uVar3 = 0;
      dVar6 = dVar5;
      do {
        (*this->lp_scaler->_vptr_SPxScaler[0x13])(this->lp_scaler,this,uVar3);
        dVar5 = extraout_XMM0_Qa;
        if (dVar6 <= extraout_XMM0_Qa) {
          dVar5 = dVar6;
        }
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
        dVar6 = dVar5;
      } while ((int)uVar2 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
  }
  else if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    lVar4 = 0;
    dVar6 = dVar5;
    do {
      dVar5 = SVectorBase<double>::minAbs
                        ((SVectorBase<double> *)
                         ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                         [lVar4].idx));
      if (dVar6 <= dVar5) {
        dVar5 = dVar6;
      }
      lVar4 = lVar4 + 1;
      dVar6 = dVar5;
    } while (lVar4 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  return dVar5;
}

Assistant:

inline
R SPxLPBase<R>::minAbsNzo(bool unscaled) const
{
   R mini = R(infinity);

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMinAbsUnscaled(*this, i);

         if(m < mini)
            mini = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).minAbs();

         if(m < mini)
            mini = m;
      }
   }

   assert(mini >= 0.0);

   return mini;
}